

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O0

int WahWah::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  StateVariableFilter *this;
  float fVar2;
  float fVar3;
  float local_94;
  float local_8c;
  float local_88;
  float bpf;
  float lpf;
  float a;
  float s;
  uint n;
  float *sc;
  float *dst;
  float *src;
  Channel *ch;
  int i;
  float bw;
  float relconst;
  float atkconst;
  float relsamples;
  float atksamples;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<WahWah::EffectData>(state);
  fVar2 = (pEVar1->field_0).data.p[0] * (float)(state->field_0).field_0.samplerate;
  fVar3 = (pEVar1->field_0).data.p[1] * (float)(state->field_0).field_0.samplerate;
  if (1.0 < fVar2) {
    local_88 = powf(0.01,1.0 / fVar2);
    local_88 = 1.0 - local_88;
  }
  else {
    local_88 = 1.0;
  }
  if (1.0 < fVar3) {
    local_8c = powf(0.01,1.0 / fVar3);
    local_8c = 1.0 - local_8c;
  }
  else {
    local_8c = 1.0;
  }
  fVar2 = powf((pEVar1->field_0).data.p[4] * -0.999 + 1.0,3.0);
  for (ch._0_4_ = 0; (int)ch < inchannels; ch._0_4_ = (int)ch + 1) {
    this = (StateVariableFilter *)((pEVar1->field_0).pad + (long)(int)ch * 0x24 + 0x20);
    this->bandwidth = fVar2;
    this[1].bandwidth = fVar2;
    dst = inbuffer + (int)ch;
    sc = outbuffer + (int)ch;
    _s = (state->field_0).field_0.sidechainbuffer + (int)ch;
    for (a = 0.0; (uint)a < length; a = (float)((int)a + 1)) {
      fVar3 = ABS((*_s - *dst) * (pEVar1->field_0).data.p[7] + *dst);
      if (fVar3 < this[2].cutoff || fVar3 == this[2].cutoff) {
        local_94 = local_8c;
      }
      else {
        local_94 = local_88;
      }
      this[2].cutoff = (fVar3 - this[2].cutoff) * local_94 + this[2].cutoff;
      fVar3 = FastClip(this[2].cutoff * (pEVar1->field_0).data.p[3] + (pEVar1->field_0).data.p[2],
                       0.0,1.4);
      this->cutoff = fVar3;
      this[1].cutoff = this->cutoff;
      fVar3 = StateVariableFilter::ProcessLPF(this,*dst);
      StateVariableFilter::ProcessLPF(this + 1,fVar3);
      fVar3 = (this[1].lpf - this->lpf) * (pEVar1->field_0).data.p[6] + this->lpf;
      *sc = (((this[1].bpf - this->bpf) * (pEVar1->field_0).data.p[6] + this->bpf) - fVar3) *
            (pEVar1->field_0).data.p[5] + fVar3;
      dst = dst + inchannels;
      sc = sc + outchannels;
      _s = _s + inchannels;
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        const float atksamples = data->p[P_ATK] * state->samplerate;
        const float relsamples = data->p[P_REL] * state->samplerate;
        const float atkconst = (atksamples <= 1.0f) ? 1.0f : (1.0f - powf(0.01f, 1.0f / atksamples));
        const float relconst = (relsamples <= 1.0f) ? 1.0f : (1.0f - powf(0.01f, 1.0f / relsamples));
        const float bw = powf(1.0f - 0.999f * data->p[P_RESO], 3.0f);

        for (int i = 0; i < inchannels; i++)
        {
            EffectData::Data::Channel& ch = data->channels[i];
            ch.filter1.bandwidth = bw;
            ch.filter2.bandwidth = bw;
            float* src = inbuffer + i;
            float* dst = outbuffer + i;
            float* sc = state->sidechainbuffer + i;
            for (unsigned int n = 0; n < length; n++)
            {
                float s = *src;
                float a = fabsf(s + (*sc - s) * data->p[P_SIDECHAIN]);
                ch.env += (a - ch.env) * ((a > ch.env) ? atkconst : relconst);
                ch.filter1.cutoff = FastClip(data->p[P_BASE] + ch.env * data->p[P_SENS], 0.0f, 1.4f);
                ch.filter2.cutoff = ch.filter1.cutoff;
                ch.filter2.ProcessLPF(ch.filter1.ProcessLPF(*src));
                float lpf = ch.filter1.lpf + (ch.filter2.lpf - ch.filter1.lpf) * data->p[P_DEPTH];
                float bpf = ch.filter1.bpf + (ch.filter2.bpf - ch.filter1.bpf) * data->p[P_DEPTH];
                *dst = lpf + (bpf - lpf) * data->p[P_TYPE];
                src += inchannels;
                dst += outchannels;
                sc += inchannels;
            }
        }

        return UNITY_AUDIODSP_OK;
    }